

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

void __thiscall spvtools::opt::IRContext::BuildValueNumberTable(IRContext *this)

{
  byte *pbVar1;
  pointer pVVar2;
  IRContext *local_20;
  pointer local_18;
  
  local_20 = this;
  MakeUnique<spvtools::opt::ValueNumberTable,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  pVVar2 = local_18;
  local_18 = (pointer)0x0;
  std::
  __uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
           *)&this->vn_table_,pVVar2);
  pVVar2 = local_18;
  if (local_18 != (pointer)0x0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)local_18 + 0x38));
    std::
    _Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)pVVar2);
    operator_delete(pVVar2,0x80);
  }
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 4;
  return;
}

Assistant:

void BuildValueNumberTable() {
    vn_table_ = MakeUnique<ValueNumberTable>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisValueNumberTable;
  }